

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O2

void __thiscall
btCollisionWorld::convexSweepTest
          (btCollisionWorld *this,btConvexShape *castShape,btTransform *convexFromWorld,
          btTransform *convexToWorld,ConvexResultCallback *resultCallback,
          btScalar allowedCcdPenetration)

{
  CProfileSample __profile;
  btVector3 angVel;
  btVector3 castShapeAabbMax;
  btVector3 castShapeAabbMin;
  btVector3 linVel;
  btSingleSweepCallback convexCB;
  btTransform convexFromTrans;
  btTransform convexToTrans;
  CProfileSample local_1ed;
  btScalar local_1ec;
  btVector3 local_1e8;
  btVector3 local_1d0;
  btVector3 local_1c0;
  btVector3 local_1b0;
  btQuadWord local_1a0;
  btVector3 local_190;
  btSingleSweepCallback local_180;
  btTransform local_a8;
  btTransform local_68;
  
  local_1ec = allowedCcdPenetration;
  CProfileManager::Start_Profile("convexSweepTest");
  local_a8.m_basis.m_el[0].m_floats._0_8_ =
       *(undefined8 *)(convexFromWorld->m_basis).m_el[0].m_floats;
  local_a8.m_basis.m_el[0].m_floats._8_8_ =
       *(undefined8 *)((convexFromWorld->m_basis).m_el[0].m_floats + 2);
  local_a8.m_basis.m_el[1].m_floats._0_8_ =
       *(undefined8 *)(convexFromWorld->m_basis).m_el[1].m_floats;
  local_a8.m_basis.m_el[1].m_floats._8_8_ =
       *(undefined8 *)((convexFromWorld->m_basis).m_el[1].m_floats + 2);
  local_a8.m_basis.m_el[2].m_floats._0_8_ =
       *(undefined8 *)(convexFromWorld->m_basis).m_el[2].m_floats;
  local_a8.m_basis.m_el[2].m_floats._8_8_ =
       *(undefined8 *)((convexFromWorld->m_basis).m_el[2].m_floats + 2);
  local_a8.m_origin.m_floats._0_8_ = *(undefined8 *)(convexFromWorld->m_origin).m_floats;
  local_a8.m_origin.m_floats._8_8_ = *(undefined8 *)((convexFromWorld->m_origin).m_floats + 2);
  local_68.m_basis.m_el[0].m_floats._0_8_ = *(undefined8 *)(convexToWorld->m_basis).m_el[0].m_floats
  ;
  local_68.m_basis.m_el[0].m_floats._8_8_ =
       *(undefined8 *)((convexToWorld->m_basis).m_el[0].m_floats + 2);
  local_68.m_basis.m_el[1].m_floats._0_8_ = *(undefined8 *)(convexToWorld->m_basis).m_el[1].m_floats
  ;
  local_68.m_basis.m_el[1].m_floats._8_8_ =
       *(undefined8 *)((convexToWorld->m_basis).m_el[1].m_floats + 2);
  local_68.m_basis.m_el[2].m_floats._0_8_ = *(undefined8 *)(convexToWorld->m_basis).m_el[2].m_floats
  ;
  local_68.m_basis.m_el[2].m_floats._8_8_ =
       *(undefined8 *)((convexToWorld->m_basis).m_el[2].m_floats + 2);
  local_68.m_origin.m_floats._0_8_ = *(undefined8 *)(convexToWorld->m_origin).m_floats;
  local_68.m_origin.m_floats._8_8_ = *(undefined8 *)((convexToWorld->m_origin).m_floats + 2);
  btTransformUtil::calculateVelocity(&local_a8,&local_68,1.0,&local_190,&local_1d0);
  local_1e8.m_floats[0] = 0.0;
  local_1e8.m_floats[1] = 0.0;
  local_1e8.m_floats[2] = 0.0;
  local_1e8.m_floats[3] = 0.0;
  local_180.super_btBroadphaseRayCallback.super_btBroadphaseAabbCallback.
  _vptr_btBroadphaseAabbCallback._0_4_ = 0x3f800000;
  local_180.super_btBroadphaseRayCallback._4_8_ = 0;
  local_180.super_btBroadphaseRayCallback.m_rayDirectionInverse.m_floats[1] = 0.0;
  local_180.super_btBroadphaseRayCallback.m_rayDirectionInverse.m_floats[2] = 0.0;
  local_180.super_btBroadphaseRayCallback.m_rayDirectionInverse.m_floats[3] = 1.0;
  local_180.super_btBroadphaseRayCallback.m_signs[0] = 0;
  local_180.super_btBroadphaseRayCallback.m_signs[1] = 0;
  local_180.super_btBroadphaseRayCallback.m_signs[2] = 0;
  local_180.super_btBroadphaseRayCallback.m_lambda_max = 0.0;
  local_180.m_convexFromTrans.m_basis.m_el[0].m_floats[0] = 1.0;
  local_180.m_convexFromTrans.m_basis.m_el[0].m_floats[1] = 0.0;
  local_180.m_convexFromTrans.m_basis.m_el[0].m_floats[2] = 0.0;
  local_180.m_convexFromTrans.m_basis.m_el[0].m_floats[3] = 0.0;
  local_180.m_convexFromTrans.m_basis.m_el[1].m_floats[0] = 0.0;
  local_180.m_convexFromTrans.m_basis.m_el[1].m_floats[1] = 0.0;
  local_1a0.m_floats = (btScalar  [4])btTransform::getRotation(&local_a8);
  btMatrix3x3::setRotation((btMatrix3x3 *)&local_180,(btQuaternion *)&local_1a0);
  btCollisionShape::calculateTemporalAabb
            (&castShape->super_btCollisionShape,(btTransform *)&local_180,&local_1e8,&local_1d0,1.0,
             &local_1b0,&local_1c0);
  btSingleSweepCallback::btSingleSweepCallback
            (&local_180,castShape,convexFromWorld,convexToWorld,this,resultCallback,local_1ec);
  (*this->m_broadphasePairCache->_vptr_btBroadphaseInterface[6])
            (this->m_broadphasePairCache,&local_a8.m_origin,&local_68.m_origin,&local_180,&local_1b0
             ,&local_1c0);
  CProfileSample::~CProfileSample(&local_1ed);
  return;
}

Assistant:

void	btCollisionWorld::convexSweepTest(const btConvexShape* castShape, const btTransform& convexFromWorld, const btTransform& convexToWorld, ConvexResultCallback& resultCallback, btScalar allowedCcdPenetration) const
{

	BT_PROFILE("convexSweepTest");
	/// use the broadphase to accelerate the search for objects, based on their aabb
	/// and for each object with ray-aabb overlap, perform an exact ray test
	/// unfortunately the implementation for rayTest and convexSweepTest duplicated, albeit practically identical



	btTransform	convexFromTrans,convexToTrans;
	convexFromTrans = convexFromWorld;
	convexToTrans = convexToWorld;
	btVector3 castShapeAabbMin, castShapeAabbMax;
	/* Compute AABB that encompasses angular movement */
	{
		btVector3 linVel, angVel;
		btTransformUtil::calculateVelocity (convexFromTrans, convexToTrans, 1.0f, linVel, angVel);
		btVector3 zeroLinVel;
		zeroLinVel.setValue(0,0,0);
		btTransform R;
		R.setIdentity ();
		R.setRotation (convexFromTrans.getRotation());
		castShape->calculateTemporalAabb (R, zeroLinVel, angVel, 1.0f, castShapeAabbMin, castShapeAabbMax);
	}

#ifndef USE_BRUTEFORCE_RAYBROADPHASE

	btSingleSweepCallback	convexCB(castShape,convexFromWorld,convexToWorld,this,resultCallback,allowedCcdPenetration);

	m_broadphasePairCache->rayTest(convexFromTrans.getOrigin(),convexToTrans.getOrigin(),convexCB,castShapeAabbMin,castShapeAabbMax);

#else
	/// go over all objects, and if the ray intersects their aabb + cast shape aabb,
	// do a ray-shape query using convexCaster (CCD)
	int i;
	for (i=0;i<m_collisionObjects.size();i++)
	{
		btCollisionObject*	collisionObject= m_collisionObjects[i];
		//only perform raycast if filterMask matches
		if(resultCallback.needsCollision(collisionObject->getBroadphaseHandle())) {
			//RigidcollisionObject* collisionObject = ctrl->GetRigidcollisionObject();
			btVector3 collisionObjectAabbMin,collisionObjectAabbMax;
			collisionObject->getCollisionShape()->getAabb(collisionObject->getWorldTransform(),collisionObjectAabbMin,collisionObjectAabbMax);
			AabbExpand (collisionObjectAabbMin, collisionObjectAabbMax, castShapeAabbMin, castShapeAabbMax);
			btScalar hitLambda = btScalar(1.); //could use resultCallback.m_closestHitFraction, but needs testing
			btVector3 hitNormal;
			if (btRayAabb(convexFromWorld.getOrigin(),convexToWorld.getOrigin(),collisionObjectAabbMin,collisionObjectAabbMax,hitLambda,hitNormal))
			{
				objectQuerySingle(castShape, convexFromTrans,convexToTrans,
					collisionObject,
					collisionObject->getCollisionShape(),
					collisionObject->getWorldTransform(),
					resultCallback,
					allowedCcdPenetration);
			}
		}
	}
#endif //USE_BRUTEFORCE_RAYBROADPHASE
}